

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

json __thiscall inja::Environment::load_json(Environment *this,string *filename)

{
  byte bVar1;
  FileError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  json_value extraout_RDX;
  json jVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> first;
  istreambuf_iterator<char,_std::char_traits<char>_> last;
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  local_380;
  istreambuf_iterator<char,_std::char_traits<char>_> local_360;
  istreambuf_iterator<char,_std::char_traits<char>_> local_350;
  undefined1 local_339;
  path local_338;
  path local_310;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  path local_278;
  path local_250;
  basic_ifstream<char,_std::char_traits<char>_> local_228 [8];
  ifstream file;
  string *filename_local;
  Environment *this_local;
  
  ::std::ifstream::ifstream(local_228);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_278,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_250,(path *)(filename + 0x14),&local_278);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (local_228,&local_250,_S_in);
  std::filesystem::__cxx11::path::~path(&local_250);
  std::filesystem::__cxx11::path::~path(&local_278);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (&local_350,(istream_type *)local_228);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(&local_360);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::function(&local_380,(nullptr_t)0x0);
    last._M_sbuf = (streambuf_type *)(ulong)(uint)local_350._M_c;
    first._8_8_ = local_350._M_sbuf;
    first._M_sbuf = (streambuf_type *)this;
    last._8_8_ = local_360._M_sbuf;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::istreambuf_iterator<char,std::char_traits<char>>>
              (first,last,(parser_callback_t *)(ulong)(uint)local_360._M_c,SUB81(&local_380,0),true)
    ;
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::~function(&local_380);
    ::std::ifstream::~ifstream(local_228);
    jVar2.m_data.m_value.object = extraout_RDX.object;
    jVar2.m_data._0_8_ = this;
    return (json)jVar2.m_data;
  }
  local_339 = 1;
  this_00 = (FileError *)__cxa_allocate_exception(0x60);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_338,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_310,(path *)(filename + 0x14),&local_338);
  std::filesystem::__cxx11::path::string(&local_2e8,&local_310);
  ::std::operator+(&local_2c8,"failed accessing file at \'",&local_2e8);
  ::std::operator+(&local_2a8,&local_2c8,"\'");
  FileError::FileError(this_00,&local_2a8);
  local_339 = 0;
  __cxa_throw(this_00,&FileError::typeinfo,FileError::~FileError);
}

Assistant:

json load_json(const std::string& filename) {
    std::ifstream file;
    file.open(input_path / filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + (input_path / filename).string() + "'"));
    }

    return json::parse(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>());
  }